

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O2

int64_t __thiscall cali::StringConverter::to_int64(StringConverter *this,bool *okptr)

{
  longlong lVar1;
  
  lVar1 = std::__cxx11::stoll(&this->m_str,(size_t *)0x0,10);
  if (okptr != (bool *)0x0) {
    *okptr = true;
  }
  return lVar1;
}

Assistant:

int64_t cali::StringConverter::to_int64(bool* okptr) const
{
    bool    ok  = false;
    int64_t res = 0;

    try {
        res = std::stoll(m_str);
        ok  = true;
    } catch (...) {
        ok = false;
    }

    if (okptr)
        *okptr = ok;

    return res;
}